

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

uint64_t address_space_ldq_m68k
                   (uc_struct_conflict3 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  uint64_t uVar1;
  MemTxResult *result_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  uc_struct_conflict3 *uc_local;
  MemTxAttrs attrs_local;
  
  uVar1 = address_space_ldq_internal_m68k(uc,as,addr,attrs,result,DEVICE_NATIVE_ENDIAN);
  return uVar1;
}

Assistant:

uint64_t glue(address_space_ldq, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_ldq_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                                    DEVICE_NATIVE_ENDIAN);
}